

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitTableSize(PrintExpressionContents *this,TableSize *curr)

{
  string_view str;
  
  str._M_str = "table.size ";
  str._M_len = 0xb;
  printMedium(this->o,str);
  Name::print(&curr->table,this->o);
  return;
}

Assistant:

void visitTableSize(TableSize* curr) {
    printMedium(o, "table.size ");
    curr->table.print(o);
  }